

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash_dictionary_handler.c
# Opt level: O2

planck_unit_suite_t * open_address_hashmap_handler_getsuite(void)

{
  planck_unit_suite_t *suite;
  
  suite = planck_unit_new_suite();
  planck_unit_add_to_suite
            (suite,test_open_address_hashmap_handler_function_registration,
             "test_open_address_hashmap_handler_function_registration",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
            );
  planck_unit_add_to_suite
            (suite,test_open_address_hashmap_handler_create_destroy,
             "test_open_address_hashmap_handler_create_destroy",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
            );
  planck_unit_add_to_suite
            (suite,test_open_address_dictionary_predicate_equality,
             "test_open_address_dictionary_predicate_equality",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
            );
  planck_unit_add_to_suite
            (suite,test_open_address_dictionary_predicate_range_signed,
             "test_open_address_dictionary_predicate_range_signed",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
            );
  planck_unit_add_to_suite
            (suite,test_open_address_dictionary_predicate_range_unsigned,
             "test_open_address_dictionary_predicate_range_unsigned",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
            );
  planck_unit_add_to_suite
            (suite,test_open_address_dictionary_cursor_equality,
             "test_open_address_dictionary_cursor_equality",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
            );
  planck_unit_add_to_suite
            (suite,test_open_address_dictionary_handler_query_with_results,
             "test_open_address_dictionary_handler_query_with_results",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
            );
  planck_unit_add_to_suite
            (suite,test_open_address_dictionary_handler_query_no_results,
             "test_open_address_dictionary_handler_query_no_results",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
            );
  planck_unit_add_to_suite
            (suite,test_open_address_dictionary_cursor_range,
             "test_open_address_dictionary_cursor_range",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
            );
  return suite;
}

Assistant:

planck_unit_suite_t *
open_address_hashmap_handler_getsuite(
) {
	planck_unit_suite_t *suite = planck_unit_new_suite();

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_open_address_hashmap_handler_function_registration);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_open_address_hashmap_handler_create_destroy);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_open_address_dictionary_predicate_equality);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_open_address_dictionary_predicate_range_signed);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_open_address_dictionary_predicate_range_unsigned);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_open_address_dictionary_cursor_equality);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_open_address_dictionary_handler_query_with_results);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_open_address_dictionary_handler_query_no_results);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_open_address_dictionary_cursor_range);

	return suite;
}